

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O0

void ZydisReEncodeInstruction
               (ZydisDecoder *decoder,ZydisDecodedInstruction *insn1,ZydisDecodedOperand *operands1,
               ZyanU8 operand_count,ZyanU8 *insn1_bytes)

{
  undefined1 local_648 [8];
  ZydisDecodedOperand operands2 [10];
  ZydisDecodedInstruction insn2;
  ZyanUSize encoded_length;
  ZyanU8 encoded_instruction [15];
  ZyanStatus status;
  ZydisEncoderRequest request;
  ZyanU8 *insn1_bytes_local;
  ZyanU8 operand_count_local;
  ZydisDecodedOperand *operands1_local;
  ZydisDecodedInstruction *insn1_local;
  ZydisDecoder *decoder_local;
  
  ZydisPrintInstruction(insn1,operands1,operand_count,insn1_bytes);
  ZydisValidateEnumRanges(insn1,operands1,operand_count);
  if (operand_count < insn1->operand_count_visible) {
    __assert_fail("operand_count >= insn1->operand_count_visible",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                  ,0x1dd,
                  "void ZydisReEncodeInstruction(const ZydisDecoder *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, const ZyanU8 *)"
                 );
  }
  encoded_instruction._7_4_ =
       ZydisEncoderDecodedInstructionToEncoderRequest
                 (insn1,operands1,insn1->operand_count_visible,
                  (ZydisEncoderRequest *)(encoded_instruction + 0xb));
  if ((encoded_instruction._7_4_ & 0x80000000) != 0) {
    fputs("ZydisEncoderDecodedInstructionToEncoderRequest failed\n",_stderr);
    abort();
  }
  insn2.raw.imm[1].size = '\x0f';
  insn2.raw.imm[1].offset = '\0';
  insn2.raw.imm[1]._18_6_ = 0;
  encoded_instruction._7_4_ =
       ZydisEncoderEncodeInstruction
                 ((ZydisEncoderRequest *)(encoded_instruction + 0xb),
                  (void *)((long)&encoded_length + 5),(ZyanUSize *)&insn2.raw.imm[1].size);
  if ((encoded_instruction._7_4_ & 0x80000000) != 0) {
    fputs("Failed to re-encode instruction\n",_stderr);
    abort();
  }
  encoded_instruction._7_4_ =
       ZydisDecoderDecodeFull
                 (decoder,(void *)((long)&encoded_length + 5),insn2.raw.imm[1]._16_8_,
                  (ZydisDecodedInstruction *)&operands2[9].field_10.mem.disp.offset,
                  (ZydisDecodedOperand *)local_648);
  if ((encoded_instruction._7_4_ & 0x80000000) != 0) {
    fputs("Failed to decode re-encoded instruction\n",_stderr);
    abort();
  }
  ZydisPrintInstruction
            ((ZydisDecodedInstruction *)&operands2[9].field_10.mem.disp.offset,
             (ZydisDecodedOperand *)local_648,insn2.opcode_map._1_1_,
             (ZyanU8 *)((long)&encoded_length + 5));
  ZydisValidateEnumRanges
            ((ZydisDecodedInstruction *)&operands2[9].field_10.mem.disp.offset,
             (ZydisDecodedOperand *)local_648,insn2.opcode_map._1_1_);
  ZydisValidateInstructionIdentity
            (insn1,operands1,(ZydisDecodedInstruction *)&operands2[9].field_10.mem.disp.offset,
             (ZydisDecodedOperand *)local_648);
  if (insn1->length < (byte)(undefined1)insn2.machine_mode) {
    fputs("Suboptimal output size detected\n",_stderr);
    abort();
  }
  ZydisReEncodeInstructionAbsolute
            ((ZydisEncoderRequest *)(encoded_instruction + 0xb),
             (ZydisDecodedInstruction *)&operands2[9].field_10.mem.disp.offset,
             (ZydisDecodedOperand *)local_648,(ZyanU8 *)((long)&encoded_length + 5));
  return;
}

Assistant:

void ZydisReEncodeInstruction(const ZydisDecoder *decoder, const ZydisDecodedInstruction *insn1,
    const ZydisDecodedOperand* operands1, ZyanU8 operand_count, const ZyanU8 *insn1_bytes)
{
    ZydisPrintInstruction(insn1, operands1, operand_count, insn1_bytes);
    ZydisValidateEnumRanges(insn1, operands1, operand_count);

    ZYAN_ASSERT(operand_count >= insn1->operand_count_visible);

    ZydisEncoderRequest request;
    ZyanStatus status = ZydisEncoderDecodedInstructionToEncoderRequest(insn1, operands1,
        insn1->operand_count_visible, &request);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("ZydisEncoderDecodedInstructionToEncoderRequest failed\n", ZYAN_STDERR);
        abort();
    }

    ZyanU8 encoded_instruction[ZYDIS_MAX_INSTRUCTION_LENGTH];
    ZyanUSize encoded_length = sizeof(encoded_instruction);
    status = ZydisEncoderEncodeInstruction(&request, encoded_instruction, &encoded_length);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to re-encode instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisDecodedInstruction insn2;
    ZydisDecodedOperand operands2[ZYDIS_MAX_OPERAND_COUNT];
    status = ZydisDecoderDecodeFull(decoder, encoded_instruction, encoded_length, &insn2,
        operands2);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to decode re-encoded instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisPrintInstruction(&insn2, operands2, insn2.operand_count_visible, encoded_instruction);
    ZydisValidateEnumRanges(&insn2, operands2, insn2.operand_count_visible);
    ZydisValidateInstructionIdentity(insn1, operands1, &insn2, operands2);

    if (insn2.length > insn1->length)
    {
        fputs("Suboptimal output size detected\n", ZYAN_STDERR);
        abort();
    }

    ZydisReEncodeInstructionAbsolute(&request, &insn2, operands2, encoded_instruction);
}